

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

uint * fetchRGBToRGB32<(QImage::Format)29>
                 (uint *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
                 QDitherInfo *param_6)

{
  uint uVar1;
  QList<unsigned_int> *extraout_RDX;
  ulong uVar2;
  ulong uVar3;
  
  if ((_qt_cpu_features & 4) == 0) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)count;
    if (count < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = fetchPixel<(QPixelLayout::BPP)5>(src,(int)uVar2 + index);
      buffer[uVar2] = uVar1 & 0xff00 | uVar1 << 0x10 | uVar1 >> 0x10 & 0xff | 0xff000000;
    }
  }
  else {
    fetchPixelsBPP24_ssse3(buffer,src,index,count);
    convertToRGB32<(QImage::Format)29>(buffer,count,extraout_RDX);
  }
  return buffer;
}

Assistant:

static const uint *QT_FASTCALL fetchRGBToRGB32(uint *buffer, const uchar *src, int index, int count,
                                               const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP BPP = bitsPerPixel<Format>();
#if defined(__SSE2__) && !defined(__SSSE3__) && QT_COMPILER_SUPPORTS_SSSE3
    if (BPP == QPixelLayout::BPP24 && qCpuHasFeature(SSSE3)) {
        // With SSE2 can convertToRGB32 be vectorized, but it takes SSSE3
        // to vectorize the deforested version below.
        fetchPixelsBPP24_ssse3(buffer, src, index, count);
        convertToRGB32<Format>(buffer, count, nullptr);
        return buffer;
    }
#elif defined QT_COMPILER_SUPPORTS_LSX
    if (BPP == QPixelLayout::BPP24 && qCpuHasFeature(LSX)) {
        fetchPixelsBPP24_lsx(buffer, src, index, count);
        convertToRGB32<Format>(buffer, count, nullptr);
        return buffer;
    }
#endif
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32<Format>(fetchPixel<BPP>(src, index + i));
    return buffer;
}